

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O1

void VP8LPutBitsFlushBits(VP8LBitWriter *bw)

{
  ulong uVar1;
  uint8_t *puVar2;
  int iVar3;
  
  if ((bw->end < bw->cur + 4) &&
     (iVar3 = VP8LBitWriterResize(bw,(size_t)(bw->end + (0x8000 - (long)bw->buf))), iVar3 == 0)) {
    bw->cur = bw->buf;
    bw->error = 1;
    return;
  }
  uVar1 = bw->bits;
  puVar2 = bw->cur;
  *(int *)puVar2 = (int)uVar1;
  bw->cur = puVar2 + 4;
  bw->bits = uVar1 >> 0x20;
  bw->used = bw->used + -0x20;
  return;
}

Assistant:

void VP8LPutBitsFlushBits(VP8LBitWriter* const bw) {
  // If needed, make some room by flushing some bits out.
  if (bw->cur + VP8L_WRITER_BYTES > bw->end) {
    const uint64_t extra_size = (bw->end - bw->buf) + MIN_EXTRA_SIZE;
    if (!CheckSizeOverflow(extra_size) ||
        !VP8LBitWriterResize(bw, (size_t)extra_size)) {
      bw->cur = bw->buf;
      bw->error = 1;
      return;
    }
  }
  *(vp8l_wtype_t*)bw->cur = (vp8l_wtype_t)WSWAP((vp8l_wtype_t)bw->bits);
  bw->cur += VP8L_WRITER_BYTES;
  bw->bits >>= VP8L_WRITER_BITS;
  bw->used -= VP8L_WRITER_BITS;
}